

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

point3f tinyusdz::value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::point3f,double,float,3ul>
                  (matrix4d *m,point3f *v)

{
  double dVar1;
  point3f pVar2;
  float *pfVar3;
  float fVar4;
  ulong local_40;
  size_t i;
  Ty value;
  size_t j;
  point3f *v_local;
  matrix4d *m_local;
  undefined4 uStack_10;
  point3f ret;
  
  for (value = 0.0; (ulong)value < 3; value = (Ty)((long)value + 1)) {
    i = 0;
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      dVar1 = m->m[local_40][(long)value];
      fVar4 = point3f::operator[](v,local_40);
      i = (size_t)(dVar1 * (double)fVar4 + (double)i);
    }
    pfVar3 = point3f::operator[]((point3f *)((long)&m_local + 4),(size_t)value);
    *pfVar3 = (float)(double)i;
  }
  pVar2.z = ret.x;
  pVar2.x = (float)m_local._4_4_;
  pVar2.y = (float)uStack_10;
  return pVar2;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}